

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O1

void test_cio_write_buffer_split_and_append(void)

{
  long ***ppplVar1;
  long ***ppplVar2;
  int iVar3;
  long ****pppplVar4;
  long ***ppplVar5;
  long ****pppplVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long ****pppplVar11;
  cio_write_buffer wbh_to_append;
  cio_write_buffer wbh_to_split;
  char buf [100];
  int local_e4;
  long ***local_e0;
  long ***local_d8;
  long local_d0;
  long lStack_c8;
  long ***local_c0;
  long ***local_b8;
  long local_b0;
  long lStack_a8;
  ulong local_a0;
  char local_98 [104];
  
  local_e4 = 1;
  local_a0 = 0;
  do {
    local_b0 = 0;
    lStack_a8 = 0;
    uVar10 = 0;
    local_c0 = (long ***)&local_c0;
    local_b8 = (long ***)&local_c0;
    do {
      pppplVar4 = (long ****)malloc(0x20);
      if (pppplVar4 == (long ****)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x11d);
      }
      ppplVar5 = (long ***)malloc(100);
      if (ppplVar5 == (long ***)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x11f);
      }
      iVar3 = snprintf((char *)ppplVar5,99,"SL_BUFFER%u",uVar10);
      if (99 < iVar3) {
        UnityFail("Write buffer for split list not filled correctly!",0x122);
      }
      pppplVar4[2] = ppplVar5;
      pppplVar4[3] = (long ***)0x64;
      *pppplVar4 = (long ***)&local_c0;
      pppplVar4[1] = local_b8;
      *local_b8 = (long **)pppplVar4;
      local_b0 = local_b0 + 1;
      lStack_a8 = lStack_a8 + (long)pppplVar4[3];
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      local_b8 = (long ***)pppplVar4;
    } while (uVar9 != 6);
    local_d0 = 0;
    lStack_c8 = 0;
    uVar9 = 0;
    local_e0 = (long ***)&local_e0;
    local_d8 = (long ***)&local_e0;
    do {
      pppplVar4 = (long ****)malloc(0x20);
      if (pppplVar4 == (long ****)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x12d);
      }
      ppplVar5 = (long ***)malloc(100);
      if (ppplVar5 == (long ***)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x12f);
      }
      iVar3 = snprintf((char *)ppplVar5,99,"AL_BUFFER%u",(ulong)uVar9);
      if (99 < iVar3) {
        UnityFail("Write buffer for append list not filled correctly!",0x132);
      }
      pppplVar4[2] = ppplVar5;
      pppplVar4[3] = (long ***)0x64;
      *pppplVar4 = (long ***)&local_e0;
      pppplVar4[1] = local_d8;
      *local_d8 = (long **)pppplVar4;
      uVar10 = local_a0;
      local_d8 = (long ***)pppplVar4;
      local_d0 = local_d0 + 1;
      lStack_c8 = lStack_c8 + (long)pppplVar4[3];
      uVar9 = uVar9 + 1;
      pppplVar6 = &local_c0;
      iVar3 = local_e4;
    } while (uVar9 == 1);
    do {
      pppplVar6 = (long ****)*pppplVar6;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    if ((long ****)local_c0 != &local_c0) {
      if (&local_c0 == pppplVar6) {
        pppplVar6 = (long ****)local_c0;
      }
      if (pppplVar6 == &local_c0) {
        lVar7 = 0;
        lVar8 = 0;
      }
      else {
        lVar8 = 0;
        lVar7 = 0;
        pppplVar11 = pppplVar6;
        do {
          lVar7 = lVar7 + (long)pppplVar11[3];
          lVar8 = lVar8 + 1;
          pppplVar11 = (long ****)*pppplVar11;
        } while (pppplVar11 != &local_c0);
      }
      pppplVar11 = (long ****)pppplVar6[1];
      *pppplVar11 = (long ***)&local_c0;
      *local_b8 = (long **)&local_e0;
      local_d8 = local_b8;
      *pppplVar4 = (long ***)pppplVar6;
      pppplVar6[1] = (long ***)pppplVar4;
      local_d0 = local_d0 + lVar8;
      lStack_c8 = lStack_c8 + lVar7;
      local_b8 = (long ***)pppplVar11;
      local_b0 = local_b0 - lVar8;
      lStack_a8 = lStack_a8 - lVar7;
    }
    UnityAssertEqualNumber
              (local_a0,local_b0,"Number of elements in splitted list not correct!",0x13f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (uVar10 * 100,lStack_a8,"Total size of splitted list not correct!",0x140,
               UNITY_DISPLAY_STYLE_INT);
    lVar7 = 8 - uVar10;
    UnityAssertEqualNumber
              (lVar7,local_d0,"Number of elements in appended list not correct!",0x141,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (lVar7 * 100,lStack_c8,"Total size of appended list not correct!",0x142,
               UNITY_DISPLAY_STYLE_INT);
    uVar9 = 0;
    pppplVar4 = (long ****)local_e0;
    do {
      iVar3 = snprintf(local_98,100,"AL_BUFFER%u",(ulong)uVar9);
      if (99 < iVar3) {
        UnityFail("Check buffer for append list not filled correctly!",0x149);
      }
      UnityAssertEqualString
                (local_98,(char *)pppplVar4[2],"Data in merged append buffer not correct!",0x14b);
      pppplVar4 = (long ****)*pppplVar4;
      uVar9 = uVar9 + 1;
    } while (uVar9 == 1);
    uVar10 = local_a0 & 0xffffffff;
    do {
      iVar3 = snprintf(local_98,100,"SL_BUFFER%u",uVar10);
      if (99 < iVar3) {
        UnityFail("Check buffer for split list not filled correctly!",0x152);
      }
      UnityAssertEqualString
                (local_98,(char *)pppplVar4[2],"Data in merged split buffer not correct!",0x154);
      ppplVar5 = local_c0;
      pppplVar4 = (long ****)*pppplVar4;
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != 6);
    if ((long ****)local_c0 != (long ****)0x0 && (long ****)local_c0 != &local_c0) {
      local_b0 = local_b0 + -1;
      lStack_a8 = lStack_a8 - (long)local_c0[3];
      ppplVar1 = (long ***)*local_c0;
      ppplVar2 = (long ***)local_c0[1];
      ppplVar1[1] = (long **)ppplVar2;
      *ppplVar2 = (long **)ppplVar1;
      free(local_c0[2]);
      free(ppplVar5);
      pppplVar4 = (long ****)local_c0;
      if ((long ****)local_c0 != (long ****)0x0 && (long ****)local_c0 != &local_c0) {
        do {
          local_b0 = local_b0 + -1;
          lStack_a8 = lStack_a8 - (long)pppplVar4[3];
          ppplVar5 = *pppplVar4;
          ppplVar1 = pppplVar4[1];
          ppplVar5[1] = (long **)ppplVar1;
          *ppplVar1 = (long **)ppplVar5;
          free(pppplVar4[2]);
          free(pppplVar4);
          pppplVar4 = (long ****)0x0;
          if ((long ****)local_c0 != &local_c0) {
            pppplVar4 = (long ****)local_c0;
          }
        } while (pppplVar4 != (long ****)0x0);
      }
    }
    ppplVar5 = local_e0;
    if ((long ****)local_e0 != (long ****)0x0 && (long ****)local_e0 != &local_e0) {
      local_d0 = local_d0 + -1;
      lStack_c8 = lStack_c8 - (long)local_e0[3];
      ppplVar1 = (long ***)*local_e0;
      ppplVar2 = (long ***)local_e0[1];
      ppplVar1[1] = (long **)ppplVar2;
      *ppplVar2 = (long **)ppplVar1;
      free(local_e0[2]);
      free(ppplVar5);
      pppplVar4 = (long ****)local_e0;
      if ((long ****)local_e0 != (long ****)0x0 && (long ****)local_e0 != &local_e0) {
        do {
          local_d0 = local_d0 + -1;
          lStack_c8 = lStack_c8 - (long)pppplVar4[3];
          ppplVar5 = *pppplVar4;
          ppplVar1 = pppplVar4[1];
          ppplVar5[1] = (long **)ppplVar1;
          *ppplVar1 = (long **)ppplVar5;
          free(pppplVar4[2]);
          free(pppplVar4);
          pppplVar4 = (long ****)0x0;
          if ((long ****)local_e0 != &local_e0) {
            pppplVar4 = (long ****)local_e0;
          }
        } while (pppplVar4 != (long ****)0x0);
      }
    }
    local_a0 = local_a0 + 1;
    local_e4 = local_e4 + 1;
  } while (local_a0 != 6);
  return;
}

Assistant:

static void test_cio_write_buffer_split_and_append(void)
{
	enum { SPLIT_LIST_LENGTH = 6 };
	for (unsigned int split_position = 0; split_position < SPLIT_LIST_LENGTH; split_position++) {
		struct cio_write_buffer wbh_to_split;
		cio_write_buffer_head_init(&wbh_to_split);

		enum { DATA_BUFFER_LENGTH = 100 };
		for (unsigned int i = 0; i < SPLIT_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for split list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_split, wbe);
		}

		struct cio_write_buffer wbh_to_append;
		cio_write_buffer_head_init(&wbh_to_append);
		enum { APPEND_LIST_LENGTH = 2 };
		for (unsigned int i = 0; i < APPEND_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for append list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_append, wbe);
		}

		struct cio_write_buffer *e = &wbh_to_split;

		for (unsigned int i = 0; i <= split_position; i++) {
			e = e->next;
		}

		cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
		TEST_ASSERT_EQUAL_MESSAGE(split_position, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(split_position * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position), cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE((APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position)) * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");

		e = wbh_to_append.next;
		for (unsigned i = 0; i < APPEND_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for append list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged append buffer not correct!");
			e = e->next;
		}
		for (unsigned i = split_position; i < SPLIT_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for split list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged split buffer not correct!");
			e = e->next;
		}

		struct cio_write_buffer *remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		while (remaining_buffer_in_split_list != NULL) {
			free(remaining_buffer_in_split_list->data.element.data);
			free(remaining_buffer_in_split_list);
			remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		}

		struct cio_write_buffer *remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		while (remaining_buffer_in_append_list != NULL) {
			free(remaining_buffer_in_append_list->data.element.data);
			free(remaining_buffer_in_append_list);
			remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		}
	}
}